

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,unsigned_long value)

{
  ostream *poVar1;
  ostringstream oss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  if ((Catch *)0xff < this) {
    poVar1 = std::operator<<((ostream *)local_190," (0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,")");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( unsigned long value ) {
    std::ostringstream oss;
    oss << value;
    if( value > Detail::hexThreshold )
        oss << " (0x" << std::hex << value << ")";
    return oss.str();
}